

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O1

Error __thiscall asmjit::v1_14::JitAllocator::alloc(JitAllocator *this,Span *out,size_t size)

{
  JitAllocatorPool *pJVar1;
  long *plVar2;
  JitAllocatorOptions JVar3;
  BitWord *pBVar4;
  long lVar5;
  void *p;
  Error EVar6;
  Error EVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  JitAllocatorBlock *pJVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  uint32_t uVar17;
  ulong uVar18;
  ulong uVar19;
  size_t searchEnd;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  JitAllocatorBlock *pJVar23;
  ulong *puVar24;
  JitAllocatorBlock *pJVar25;
  JitAllocatorBlock *block;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  uint32_t allocatedAreaSize;
  JitAllocatorPrivateImpl *local_90;
  ulong local_88;
  DualMapping local_68;
  ulong local_58;
  Span *local_50;
  pthread_mutex_t *local_48;
  long local_40;
  JitAllocatorPool *local_38;
  
  out->_size = 0;
  out->_block = (void *)0x0;
  out->_rx = (void *)0x0;
  out->_rw = (void *)0x0;
  out->_flags = kNone;
  out->_reserved = 0;
  local_90 = (JitAllocatorPrivateImpl *)this->_impl;
  if (local_90 == (JitAllocatorPrivateImpl *)JitAllocatorImpl_none) {
    return 5;
  }
  uVar20 = (ulong)(local_90->super_Impl).granularity;
  uVar20 = -uVar20 & (size + uVar20) - 1;
  if (uVar20 == 0) {
    return 2;
  }
  if (0x7fffffff < uVar20) {
    return 9;
  }
  local_48 = (pthread_mutex_t *)&local_90->lock;
  local_50 = out;
  pthread_mutex_lock(local_48);
  local_38 = local_90->pools;
  lVar14 = local_90->poolCount - 1;
  if (lVar14 != 0) {
    uVar9 = (ulong)(local_90->super_Impl).granularity << ((byte)lVar14 & 0x3f);
    do {
      if ((-uVar9 & uVar9 + (uVar20 - 1)) == uVar20) goto LAB_00121206;
      uVar9 = uVar9 >> 1;
      lVar14 = lVar14 + -1;
    } while (lVar14 != 0);
    lVar14 = 0;
  }
LAB_00121206:
  local_40 = lVar14 * 9;
  local_58 = (ulong)local_38[lVar14].granularity;
  uVar9 = (uVar20 - 1) + local_58 >> (local_38[lVar14].granularityLog2 & 0x3f);
  pJVar12 = *(JitAllocatorBlock **)(local_38 + lVar14);
  uVar26 = (uint)uVar9;
  if (pJVar12 != (JitAllocatorBlock *)0x0) {
    uVar13 = uVar9 & 0xffffffff;
    local_88 = 0xffffffff;
    pJVar25 = pJVar12;
LAB_00121254:
    pJVar23 = *(JitAllocatorBlock **)&pJVar25->field_0x18;
    if (*(JitAllocatorBlock **)&pJVar25->field_0x18 == (JitAllocatorBlock *)0x0) {
      pJVar23 = pJVar12;
    }
    uVar19 = (ulong)pJVar25->_areaSize;
    if ((uVar26 <= pJVar25->_areaSize - pJVar25->_areaUsed) &&
       (((pJVar25->_flags & 4) != 0 || (uVar26 <= pJVar25->_largestUnusedArea)))) {
      uVar29 = (ulong)pJVar25->_searchEnd;
      if ((uint)(uVar19 + 0x3f >> 6) < (uint)(uVar29 + 0x3f >> 6)) {
        alloc();
        return 5;
      }
      uVar16 = pJVar25->_searchStart;
      uVar28 = (ulong)(uVar16 & 0xffffffc0);
      puVar24 = (ulong *)((ulong)(uVar16 >> 3 & 0xfffffff8) + (long)pJVar25->_usedBitVector);
      if (uVar28 < uVar29) {
        uVar27 = (~*puVar24 >> ((byte)uVar16 & 0x3f)) << ((byte)uVar16 & 0x3f);
      }
      else {
        uVar27 = 0;
      }
      uVar18 = 0xffffffffffffffff;
      uVar21 = 0;
      uVar10 = 0;
LAB_001212e5:
      bVar30 = uVar27 != 0;
      uVar15 = uVar27;
      if (uVar27 == 0) {
        uVar28 = uVar28 + 0x40;
        if (uVar28 < uVar29) {
          do {
            puVar24 = puVar24 + 1;
            bVar30 = *puVar24 != 0xffffffffffffffff;
            if (bVar30) {
              uVar15 = ~*puVar24;
              goto LAB_001212f2;
            }
            uVar28 = uVar28 + 0x40;
          } while (uVar28 < uVar29);
          uVar27 = 0;
        }
        else {
          bVar30 = false;
        }
      }
      else {
LAB_001212f2:
        lVar5 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
          }
        }
        uVar19 = -1L << ((byte)lVar5 & 0x3f);
        uVar21 = uVar28 + lVar5;
        uVar27 = uVar19 ^ uVar15;
        if (uVar19 == uVar15) {
          uVar15 = uVar28 + 0x40;
          uVar19 = uVar15;
          if (uVar29 < uVar15) {
            uVar19 = uVar29;
          }
          if ((uVar19 - uVar21 < uVar13) && (uVar28 = uVar15, uVar15 < uVar29)) {
LAB_00121343:
            puVar24 = puVar24 + 1;
            uVar27 = *puVar24;
            if (uVar27 == 0) {
              uVar28 = uVar15 + 0x40;
              uVar19 = uVar28;
              if (uVar29 < uVar28) {
                uVar19 = uVar29;
              }
              if (uVar19 - uVar21 < uVar13) goto code_r0x0012136f;
              uVar27 = 0;
              uVar28 = uVar15;
            }
            else {
              lVar5 = 0;
              if (uVar27 != 0) {
                for (; (uVar27 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
                }
              }
              uVar19 = lVar5 + uVar15;
              if (uVar29 < lVar5 + uVar15) {
                uVar19 = uVar29;
              }
              uVar27 = -1L << ((byte)lVar5 & 0x3f) ^ uVar27;
              uVar28 = uVar15;
            }
          }
        }
        else {
          lVar5 = 0;
          if (uVar27 != 0) {
            for (; (uVar27 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
            }
          }
          uVar19 = lVar5 + uVar28;
          if (uVar29 < lVar5 + uVar28) {
            uVar19 = uVar29;
          }
          uVar27 = uVar27 ^ -1L << ((byte)lVar5 & 0x3f);
        }
      }
      goto LAB_00121404;
    }
    bVar30 = false;
    block = pJVar23;
    goto LAB_00121443;
  }
  local_88 = 0xffffffff;
  block = pJVar12;
LAB_0012148a:
  pJVar1 = local_38 + lVar14;
  if ((int)local_88 != -1) {
    uVar16 = block->_flags;
    if ((uVar16 & 2) == 0) goto LAB_001217a2;
    pJVar1->emptyBlockCount = pJVar1->emptyBlockCount + 0xff;
    block->_flags = uVar16 & 0xfffffffd;
    goto LAB_001217a2;
  }
  if (*(long *)&pJVar1->field_0x8 == 0) {
    uVar13 = (ulong)(local_90->super_Impl).blockSize;
  }
  else {
    uVar13 = *(ulong *)(*(long *)&pJVar1->field_0x8 + 0x38);
  }
  JVar3 = (local_90->super_Impl).options;
  uVar19 = 0;
  if ((JVar3 & kDisableInitialPadding) == kNone) {
    uVar19 = local_58;
  }
  uVar19 = uVar19 + uVar20;
  uVar13 = uVar13 << (uVar13 < 0x4000000);
  if (uVar13 < uVar19) {
    uVar13 = (ulong)(local_90->super_Impl).blockSize;
    uVar29 = -uVar13 & (uVar19 + uVar13) - 1;
    uVar13 = 0;
    if (uVar19 <= uVar29) {
      uVar13 = uVar29;
    }
  }
  EVar6 = 0xffffffff;
  local_88 = 0xffffffff;
  if (uVar13 == 0) goto LAB_00121968;
  bVar30 = (JVar3 & kDisableInitialPadding) == kNone;
  uVar16 = (uint)bVar30;
  local_68.rx = (void *)0x0;
  local_68.rw = (void *)0x0;
  if ((JVar3 & kUseDualMapping) == kNone) {
    bVar32 = true;
    EVar7 = 0xffffffff;
    if ((JVar3 & kUseLargePages) != kNone) {
      sVar11 = VirtMem::largePageSize();
      if (uVar13 < sVar11) {
        bVar31 = ((local_90->super_Impl).options & kAlignBlockSizeToLargePage) == kNone;
      }
      else {
        bVar31 = false;
      }
      EVar7 = EVar6;
      if ((sVar11 != 0) && (!bVar31)) {
        uVar19 = -sVar11 & (uVar13 + sVar11) - 1;
        EVar6 = VirtMem::alloc(&local_68.rx,uVar19,kMMapLargePages|kAccessRWX);
        bVar32 = EVar6 != 0;
        EVar7 = uVar16;
        if (!bVar32) {
          uVar13 = uVar19;
          EVar7 = bVar30 + 8;
          uVar16 = bVar30 + 8;
        }
      }
    }
    if ((bVar32) && (EVar7 = VirtMem::alloc(&local_68.rx,uVar13,kAccessRWX), EVar7 != 0)) {
      bVar30 = false;
    }
    else {
      local_68.rw = local_68.rx;
      bVar30 = true;
    }
    if (!bVar30) goto LAB_00121770;
  }
  else {
    EVar7 = VirtMem::allocDualMapping(&local_68,uVar13,kAccessRWX);
    if (EVar7 != 0) goto LAB_00121770;
    uVar16 = bVar30 | 0x10;
  }
  uVar19 = (uVar13 + pJVar1->granularity) - 1 >> (pJVar1->granularityLog2 & 0x3f);
  uVar17 = (uint32_t)uVar19;
  uVar22 = uVar17 + 0x3f >> 6;
  pJVar12 = (JitAllocatorBlock *)malloc((ulong)(uVar22 << 4) + 0x68);
  p = local_68.rw;
  JVar3 = (local_90->super_Impl).options;
  if (pJVar12 == (JitAllocatorBlock *)0x0) {
    if ((JVar3 & kUseDualMapping) == kNone) {
      VirtMem::release(local_68.rx,uVar13);
    }
    else {
      VirtMem::releaseDualMapping(&local_68,uVar13);
    }
    EVar7 = 1;
  }
  else {
    if ((JVar3 & kFillUnusedMemory) != kNone) {
      VirtMem::protectJitMemory(kReadWrite);
      JitAllocatorImpl_fillPattern(local_68.rw,(local_90->super_Impl).fillPattern,uVar13);
      VirtMem::protectJitMemory(kReadExecute);
      VirtMem::flushInstructionCache(p,uVar13);
    }
    *(undefined8 *)&pJVar12->super_ZoneListNode<asmjit::v1_14::JitAllocatorBlock> = 0;
    *(undefined8 *)&pJVar12->field_0x18 = 0;
    *(undefined8 *)pJVar12 = 0;
    *(undefined8 *)&pJVar12->field_0x8 = 0;
    pJVar12->_pool = pJVar1;
    (pJVar12->_mapping).rx = local_68.rx;
    (pJVar12->_mapping).rw = local_68.rw;
    pJVar12->_blockSize = uVar13;
    pJVar12->_flags = uVar16;
    pJVar12->_areaSize = uVar17;
    pJVar12->_areaUsed = 0;
    pJVar12->_largestUnusedArea = 0;
    pJVar12->_searchStart = 0;
    pJVar12->_searchEnd = 0;
    pJVar12->_usedBitVector = (BitWord *)(pJVar12 + 1);
    pJVar12->_stopBitVector =
         (BitWord *)
         (&pJVar12[1].super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> + (ulong)uVar22 * 8);
    uVar13 = (ulong)((uint)((uVar19 & 0xffffffff) + 0x3f >> 3) & 0xfffffff8);
    memset(pJVar12 + 1,0,uVar13);
    EVar7 = 0;
    memset(&pJVar12[1].super_ZoneTreeNodeT<asmjit::v1_14::JitAllocatorBlock> + (ulong)uVar22 * 8,0,
           uVar13);
    *pJVar12->_usedBitVector = *pJVar12->_usedBitVector & 0xfffffffffffffffe | (ulong)(uVar16 & 1);
    *pJVar12->_stopBitVector = *pJVar12->_stopBitVector & 0xfffffffffffffffe | (ulong)(uVar16 & 1);
    uVar16 = pJVar12->_flags & 1;
    pJVar12->_areaUsed = uVar16;
    pJVar12->_largestUnusedArea = pJVar12->_areaSize - uVar16;
    pJVar12->_searchStart = uVar16;
    pJVar12->_searchEnd = pJVar12->_areaSize;
    pJVar12->_flags = pJVar12->_flags & 0xfffffff9 | 2;
    block = pJVar12;
  }
LAB_00121770:
  bVar30 = EVar7 == 0;
  if (bVar30) {
    local_88 = (ulong)(block->_flags & 1);
    JitAllocatorImpl_insertBlock(local_90,block);
    block->_searchStart = block->_searchStart + uVar26;
    block->_largestUnusedArea = block->_largestUnusedArea - uVar26;
  }
  do {
    if (!bVar30) {
LAB_0012192a:
      pthread_mutex_unlock(local_48);
      return EVar7;
    }
LAB_001217a2:
    local_90->allocationCount = local_90->allocationCount + 1;
    uVar16 = (uint)local_88;
    uVar22 = uVar16 + uVar26;
    uVar13 = uVar9 & 0xffffffff;
    if (uVar26 != 0) {
      uVar19 = 0x40 - (ulong)(uVar16 & 0x3f);
      if (uVar13 <= uVar19) {
        uVar19 = uVar13;
      }
      pBVar4 = block->_usedBitVector;
      puVar24 = pBVar4 + (local_88 >> 6) + 1;
      puVar24[-1] = puVar24[-1] |
                    (0xffffffffffffffffU >> (-(char)uVar19 & 0x3fU)) << (sbyte)(uVar16 & 0x3f);
      uVar29 = uVar13 - uVar19;
      if (0x3f < uVar29) {
        uVar29 = (uVar13 - uVar19) - 0x40;
        uVar19 = uVar29 >> 6;
        memset(puVar24,0xff,uVar19 * 8 + 8);
        uVar29 = (ulong)((uint)uVar29 & 0x3f);
        puVar24 = pBVar4 + uVar19 + (local_88 >> 6) + 2;
        local_90 = (JitAllocatorPrivateImpl *)(ulong)uVar22;
      }
      if (uVar29 != 0) {
        *puVar24 = *puVar24 | 0xffffffffffffffffU >> (-(char)uVar29 & 0x3fU);
      }
    }
    block->_stopBitVector[uVar22 - 1 >> 6] =
         block->_stopBitVector[uVar22 - 1 >> 6] | 1L << ((byte)(uVar22 - 1) & 0x3f);
    uVar8 = block->_flags;
    plVar2 = (long *)((long)block->_pool->totalAreaUsed + (ulong)(uVar8 & 8));
    *plVar2 = *plVar2 + uVar13;
    uVar17 = block->_areaUsed + uVar26;
    block->_areaUsed = uVar17;
    if (block->_areaSize == uVar17) {
      block->_searchStart = block->_areaSize;
      block->_searchEnd = 0;
      block->_largestUnusedArea = 0;
      uVar8 = uVar8 & 0xfffffff9;
    }
    else {
      if (block->_searchStart == uVar16) {
        block->_searchStart = uVar22;
      }
      if (block->_searchEnd == uVar22) {
        block->_searchEnd = uVar16;
      }
      uVar8 = uVar8 & 0xfffffff9 | 4;
    }
    block->_flags = uVar8;
    uVar13 = pJVar1->granularity * local_88;
    uVar19 = block->_blockSize - uVar20;
    if (uVar13 < uVar19 || uVar13 - uVar19 == 0) {
      local_50->_rx = (void *)((long)(block->_mapping).rx + uVar13);
      local_50->_rw = (void *)(uVar13 + (long)(block->_mapping).rw);
      local_50->_size = uVar20;
      local_50->_block = block;
      EVar7 = 0;
      goto LAB_0012192a;
    }
    alloc();
LAB_00121968:
    EVar7 = 1;
    bVar30 = false;
  } while( true );
code_r0x0012136f:
  uVar15 = uVar28;
  if (uVar29 <= uVar28) goto code_r0x0012137c;
  goto LAB_00121343;
code_r0x0012137c:
  uVar27 = 0;
LAB_00121404:
  if (!bVar30) goto LAB_00121434;
  uVar15 = uVar19 - uVar21;
  if (uVar15 < uVar13) {
    if (uVar21 < uVar18) {
      uVar18 = uVar21;
    }
    if (uVar10 <= uVar15) {
      uVar10 = uVar15;
    }
  }
  else {
    local_88 = uVar21 & 0xffffffff;
  }
  if (uVar13 <= uVar15) goto LAB_00121434;
  goto LAB_001212e5;
LAB_00121434:
  bVar30 = (int)local_88 != -1;
  block = pJVar25;
  if (((int)local_88 == -1) && (block = pJVar23, uVar18 != 0xffffffffffffffff)) {
    pJVar25->_searchStart = (uint32_t)uVar18;
    pJVar25->_searchEnd = (uint32_t)uVar19;
    pJVar25->_largestUnusedArea = (uint32_t)uVar10;
    pJVar25->_flags = pJVar25->_flags & 0xfffffffb;
  }
LAB_00121443:
  if ((bVar30) || (pJVar25 = block, block == pJVar12)) goto LAB_0012148a;
  goto LAB_00121254;
}

Assistant:

Error JitAllocator::alloc(Span& out, size_t size) noexcept {
  out = Span{};

  if (ASMJIT_UNLIKELY(_impl == &JitAllocatorImpl_none))
    return DebugUtils::errored(kErrorNotInitialized);

  JitAllocatorPrivateImpl* impl = static_cast<JitAllocatorPrivateImpl*>(_impl);
  constexpr uint32_t kNoIndex = std::numeric_limits<uint32_t>::max();

  // Align to the minimum granularity by default.
  size = Support::alignUp<size_t>(size, impl->granularity);
  if (ASMJIT_UNLIKELY(size == 0))
    return DebugUtils::errored(kErrorInvalidArgument);

  if (ASMJIT_UNLIKELY(size > std::numeric_limits<uint32_t>::max() / 2))
    return DebugUtils::errored(kErrorTooLarge);

  LockGuard guard(impl->lock);
  JitAllocatorPool* pool = &impl->pools[JitAllocatorImpl_sizeToPoolId(impl, size)];

  uint32_t areaIndex = kNoIndex;
  uint32_t areaSize = uint32_t(pool->areaSizeFromByteSize(size));

  // Try to find the requested memory area in existing blocks.
  JitAllocatorBlock* block = pool->blocks.first();
  if (block) {
    JitAllocatorBlock* initial = block;
    do {
      JitAllocatorBlock* next = block->hasNext() ? block->next() : pool->blocks.first();
      if (block->areaAvailable() >= areaSize) {
        if (block->isDirty() || block->largestUnusedArea() >= areaSize) {
          BitVectorRangeIterator<Support::BitWord, 0> it(block->_usedBitVector, pool->bitWordCountFromAreaSize(block->areaSize()), block->_searchStart, block->_searchEnd);

          size_t rangeStart = 0;
          size_t rangeEnd = block->areaSize();

          size_t searchStart = SIZE_MAX;
          size_t largestArea = 0;

          while (it.nextRange(&rangeStart, &rangeEnd, areaSize)) {
            size_t rangeSize = rangeEnd - rangeStart;
            if (rangeSize >= areaSize) {
              areaIndex = uint32_t(rangeStart);
              break;
            }

            searchStart = Support::min(searchStart, rangeStart);
            largestArea = Support::max(largestArea, rangeSize);
          }

          if (areaIndex != kNoIndex)
            break;

          if (searchStart != SIZE_MAX) {
            // Because we have iterated over the entire block, we can now mark the
            // largest unused area that can be used to cache the next traversal.
            size_t searchEnd = rangeEnd;

            block->_searchStart = uint32_t(searchStart);
            block->_searchEnd = uint32_t(searchEnd);
            block->_largestUnusedArea = uint32_t(largestArea);
            block->clearFlags(JitAllocatorBlock::kFlagDirty);
          }
        }
      }

      block = next;
    } while (block != initial);
  }

  // Allocate a new block if there is no region of a required size.
  if (areaIndex == kNoIndex) {
    size_t blockSize = JitAllocatorImpl_calculateIdealBlockSize(impl, pool, size);
    if (ASMJIT_UNLIKELY(!blockSize))
      return DebugUtils::errored(kErrorOutOfMemory);

    ASMJIT_PROPAGATE(JitAllocatorImpl_newBlock(impl, &block, pool, blockSize));
    areaIndex = block->initialAreaStart();

    JitAllocatorImpl_insertBlock(impl, block);
    block->_searchStart += areaSize;
    block->_largestUnusedArea -= areaSize;
  }
  else if (block->hasFlag(JitAllocatorBlock::kFlagEmpty)) {
    pool->emptyBlockCount--;
    block->clearFlags(JitAllocatorBlock::kFlagEmpty);
  }

  // Update statistics.
  impl->allocationCount++;
  block->markAllocatedArea(areaIndex, areaIndex + areaSize);

  // Return a span referencing the allocated memory.
  size_t offset = pool->byteSizeFromAreaSize(areaIndex);
  ASMJIT_ASSERT(offset <= block->blockSize() - size);

  out._rx = block->rxPtr() + offset;
  out._rw = block->rwPtr() + offset;
  out._size = size;
  out._block = static_cast<void*>(block);

  return kErrorOk;
}